

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O0

void __thiscall
winmd::reader::cache::add_type_to_members(cache *this,TypeDef *type,namespace_members *members)

{
  undefined8 uVar1;
  namespace_members *row;
  bool bVar2;
  category cVar3;
  CustomAttribute CVar4;
  TypeDef type_00;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  table_base *local_60;
  uint32_t local_58;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string_view local_40;
  undefined8 local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  namespace_members *local_20;
  namespace_members *members_local;
  TypeDef *type_local;
  cache *this_local;
  
  local_20 = members;
  members_local = (namespace_members *)type;
  type_local = (TypeDef *)this;
  cVar3 = get_category(type);
  row = members_local;
  switch(cVar3) {
  case interface_type:
    cppwinrt::std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
    push_back(&local_20->interfaces,(value_type *)members_local);
    break;
  case class_type:
    local_30 = *(undefined8 *)&(members_local->types)._M_t._M_impl;
    uVar1 = *(undefined8 *)&(members_local->types)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_28 = (undefined4)uVar1;
    uStack_24 = (undefined4)((ulong)uVar1 >> 0x20);
    local_40 = sv("System",6);
    local_50 = sv("Attribute",9);
    type_00.super_row_base<winmd::reader::TypeDef>.m_index = local_28;
    type_00.super_row_base<winmd::reader::TypeDef>.m_table = (table_base *)local_30;
    type_00.super_row_base<winmd::reader::TypeDef>._12_4_ = 0;
    bVar2 = extends_type(type_00,local_40,local_50);
    if (bVar2) {
      cppwinrt::std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
      push_back(&local_20->attributes,(value_type *)members_local);
    }
    else {
      cppwinrt::std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
      push_back(&local_20->classes,(value_type *)members_local);
    }
    break;
  case enum_type:
    cppwinrt::std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
    push_back(&local_20->enums,(value_type *)members_local);
    break;
  case struct_type:
    local_70 = sv("Windows.Foundation.Metadata",0x1b);
    local_80 = sv("ApiContractAttribute",0x14);
    CVar4 = get_attribute<winmd::reader::TypeDef>((TypeDef *)row,&local_70,&local_80);
    local_60 = CVar4.super_row_base<winmd::reader::CustomAttribute>.m_table;
    local_58 = CVar4.super_row_base<winmd::reader::CustomAttribute>.m_index;
    bVar2 = reader::row_base::operator_cast_to_bool((row_base *)&local_60);
    if (bVar2) {
      cppwinrt::std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
      push_back(&local_20->contracts,(value_type *)members_local);
    }
    else {
      cppwinrt::std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
      push_back(&local_20->structs,(value_type *)members_local);
    }
    break;
  case delegate_type:
    cppwinrt::std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
    push_back(&local_20->delegates,(value_type *)members_local);
  }
  return;
}

Assistant:

void add_type_to_members(TypeDef const& type, namespace_members& members)
        {
            switch (get_category(type))
            {
            case category::interface_type:
                members.interfaces.push_back(type);
                return;
            case category::class_type:
                if (extends_type(type, "System"sv, "Attribute"sv))
                {
                    members.attributes.push_back(type);
                    return;
                }
                members.classes.push_back(type);
                return;
            case category::enum_type:
                members.enums.push_back(type);
                return;
            case category::struct_type:
                if (get_attribute(type, "Windows.Foundation.Metadata"sv, "ApiContractAttribute"sv))
                {
                    members.contracts.push_back(type);
                    return;
                }
                members.structs.push_back(type);
                return;
            case category::delegate_type:
                members.delegates.push_back(type);
                return;
            }
        }